

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_parser.cpp
# Opt level: O3

TypeAst * clickhouse::ParseTypeName(string *type_name)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *type;
  undefined8 uVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
  pVar5;
  string_view name;
  TypeParser local_80;
  
  if (ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_ == '\0') {
    ParseTypeName();
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&ParseTypeName::lock);
  if (iVar2 == 0) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
            ::find(&ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_._M_t,type_name)
    ;
    if ((_Rb_tree_header *)iVar3._M_node ==
        &ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_._M_t._M_impl.
         super__Rb_tree_header) {
      type = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
             ::operator[](&ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_,
                          type_name);
      name._M_str = (type_name->_M_dataplus)._M_p;
      name._M_len = type_name->_M_string_length;
      TypeParser::TypeParser(&local_80,name);
      bVar1 = TypeParser::Parse(&local_80,type);
      TypeParser::~TypeParser(&local_80);
      if (!bVar1) {
        pVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
                ::equal_range(&ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_._M_t
                              ,type_name);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_clickhouse::TypeAst>_>_>
        ::_M_erase_aux(&ParseTypeName(std::__cxx11::string_const&)::ast_cache_abi_cxx11_._M_t,
                       (_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
        type = (mapped_type *)0x0;
      }
    }
    else {
      type = (mapped_type *)(iVar3._M_node + 2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&ParseTypeName::lock);
    return type;
  }
  uVar4 = std::__throw_system_error(iVar2);
  TypeParser::~TypeParser(&local_80);
  pthread_mutex_unlock((pthread_mutex_t *)&ParseTypeName::lock);
  _Unwind_Resume(uVar4);
}

Assistant:

const TypeAst* ParseTypeName(const std::string& type_name) {
    // Cache for type_name.
    // Usually we won't have too many type names in the cache, so do not try to
    // limit cache size.
    static std::map<std::string, TypeAst> ast_cache;
    static std::mutex lock;

    std::lock_guard<std::mutex> guard(lock);
    auto it = ast_cache.find(type_name);
    if (it != ast_cache.end()) {
        return &it->second;
    }

    auto& ast = ast_cache[type_name];
    if (TypeParser(type_name).Parse(&ast)) {
        return &ast;
    }
    ast_cache.erase(type_name);
    return nullptr;
}